

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Utilities.h
# Opt level: O3

void __thiscall
soul::heart::Utilities::
GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>
::throwCycleError(GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>
                  *this,ArrayView<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>
                        stack,CodeLocation *errorContext)

{
  pointer pcVar1;
  string *separator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  pointer pbVar2;
  value_type *pvVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nodesInCycle;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  undefined1 local_88 [32];
  CompileMessage local_68;
  
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    pcVar1 = ((*(pointer *)this)->processor->instanceName)._M_dataplus._M_p;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar1,
               pcVar1 + ((*(pointer *)this)->processor->instanceName)._M_string_length);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
               &local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    this = (GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>
            *)((long)this + 8);
  } while (this != (GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>
                    *)stack.s);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_a8,
              local_a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start);
  pvVar3 = local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  separator = (string *)
              CONCAT71((int7)((ulong)errorContext >> 8),
                       local_a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start < pvVar3 &&
                       local_a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start !=
                       local_a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  pbVar2 = local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start < pvVar3 &&
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::string::swap((string *)pbVar2);
      pbVar2 = pbVar2 + 1;
      pvVar3 = pvVar3 + -1;
    } while (pbVar2 < pvVar3);
  }
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88," -> ","");
  joinStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_c8,(soul *)&local_a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_88,separator);
  CompileMessageHelpers::createMessage<std::__cxx11::string>
            (&local_68,(CompileMessageHelpers *)0x1,none,0x27d711,(char *)&local_c8,in_R9);
  CodeLocation::throwError((CodeLocation *)stack.e,&local_68);
}

Assistant:

static void throwCycleError (ArrayView<const Node*> stack, const ContextType& errorContext)
        {
            std::vector<std::string> nodesInCycle;

            for (auto& node : stack)
                nodesInCycle.push_back (Subclass::getProcessorName (node->processor));

            nodesInCycle.push_back (nodesInCycle.front());
            std::reverse (nodesInCycle.begin(), nodesInCycle.end());

            errorContext.throwError (Errors::feedbackInGraph (joinStrings (nodesInCycle, " -> ")));
        }